

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcbormap.cpp
# Opt level: O2

void __thiscall QCborMap::detach(QCborMap *this,qsizetype reserved)

{
  QCborContainerPrivate *pQVar1;
  
  pQVar1 = (this->d).d.ptr;
  if (reserved == 0) {
    if (pQVar1 == (QCborContainerPrivate *)0x0) {
      reserved = 0;
    }
    else {
      reserved = (pQVar1->elements).d.size & 0x7fffffffffffffe;
    }
  }
  pQVar1 = QCborContainerPrivate::detach(pQVar1,reserved);
  QExplicitlySharedDataPointer<QCborContainerPrivate>::reset(&this->d,pQVar1);
  return;
}

Assistant:

void QCborMap::detach(qsizetype reserved)
{
    d = QCborContainerPrivate::detach(d.data(), reserved ? reserved : size() * 2);
}